

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O2

void __thiscall xe::ri::Image::~Image(Image *this)

{
  (this->super_Item)._vptr_Item = (_func_int **)&PTR__Image_001317a0;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::__cxx11::string::~string((string *)&this->description);
  std::__cxx11::string::~string((string *)&this->name);
  return;
}

Assistant:

~Image		(void) {}